

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

XmlWriter * __thiscall
doctest::anon_unknown_15::XmlWriter::writeAttribute(XmlWriter *this,string *name,bool attribute)

{
  ostream *poVar1;
  char *pcVar2;
  bool attribute_local;
  string *name_local;
  XmlWriter *this_local;
  
  poVar1 = std::operator<<(this->m_os,' ');
  poVar1 = std::operator<<(poVar1,(string *)name);
  poVar1 = std::operator<<(poVar1,"=\"");
  pcVar2 = "false";
  if (attribute) {
    pcVar2 = "true";
  }
  poVar1 = std::operator<<(poVar1,pcVar2);
  std::operator<<(poVar1,'\"');
  return this;
}

Assistant:

XmlWriter& XmlWriter::writeAttribute( std::string const& name, bool attribute ) {
        m_os << ' ' << name << "=\"" << ( attribute ? "true" : "false" ) << '"';
        return *this;
    }